

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O3

bool pdqsort_detail::
     partial_insertion_sort<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__1>
               (__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                begin,__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                      end,anon_class_8_1_8991fb9c comp)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  double *pdVar3;
  double dVar4;
  double dVar5;
  int iVar6;
  pointer ppVar7;
  void *pvVar8;
  double dVar9;
  double dVar10;
  pointer ppVar11;
  pointer ppVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  FractionalInteger *pFVar18;
  ulong uVar19;
  FractionalInteger *pFVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  _Var24;
  long lVar25;
  long lVar26;
  ulong local_90;
  
  if ((begin._M_current != end._M_current) && (begin._M_current + 1 != end._M_current)) {
    lVar26 = 0;
    local_90 = 0;
    pFVar18 = begin._M_current + 1;
    _Var24._M_current = begin._M_current;
    do {
      pFVar20 = pFVar18;
      dVar4 = _Var24._M_current[1].fractionality;
      iVar6 = _Var24._M_current[1].basisIndex;
      if (((_Var24._M_current)->fractionality < dVar4) ||
         (((_Var24._M_current)->fractionality <= dVar4 &&
          (uVar23 = (long)(_Var24._M_current)->basisIndex + (comp.this)->numTries,
          uVar19 = uVar23 & 0xffffffff, uVar23 = uVar23 >> 0x20,
          uVar21 = (comp.this)->numTries + (long)iVar6, uVar22 = uVar21 & 0xffffffff,
          uVar21 = uVar21 >> 0x20,
          ((uVar19 + 0x42d8680e260ae5b) * (uVar23 + 0x8a183895eeac1536) ^
          (uVar23 + 0x80c8963be3e4c2f3) * (uVar19 + 0xc8497d2a400d9551) >> 0x20) <
          ((uVar22 + 0x42d8680e260ae5b) * (uVar21 + 0x8a183895eeac1536) ^
          (uVar21 + 0x80c8963be3e4c2f3) * (uVar22 + 0xc8497d2a400d9551) >> 0x20))))) {
        dVar9 = _Var24._M_current[1].row_ep_norm2;
        dVar10 = _Var24._M_current[1].score;
        ppVar11 = _Var24._M_current[1].row_ep.
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppVar12 = _Var24._M_current[1].row_ep.
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        ppVar7 = _Var24._M_current[1].row_ep.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        _Var24._M_current[1].row_ep.
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_start = (pointer)0x0;
        _Var24._M_current[1].row_ep.
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_finish = (pointer)0x0;
        _Var24._M_current[1].row_ep.
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        lVar25 = lVar26;
        while( true ) {
          puVar1 = (undefined8 *)((long)&(begin._M_current)->fractionality + lVar25);
          uVar13 = *puVar1;
          uVar14 = puVar1[1];
          puVar1 = (undefined8 *)((long)&(begin._M_current)->row_ep_norm2 + lVar25 + 4);
          uVar15 = puVar1[1];
          puVar2 = (undefined8 *)
                   ((long)&((begin._M_current)->row_ep).
                           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar25);
          uVar16 = *puVar2;
          uVar17 = puVar2[1];
          puVar2 = (undefined8 *)((long)&begin._M_current[1].row_ep_norm2 + lVar25 + 4);
          *puVar2 = *puVar1;
          puVar2[1] = uVar15;
          puVar1 = (undefined8 *)((long)&begin._M_current[1].fractionality + lVar25);
          *puVar1 = uVar13;
          puVar1[1] = uVar14;
          pvVar8 = *(void **)((long)&begin._M_current[1].row_ep.
                                     super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + lVar25);
          puVar1 = (undefined8 *)
                   ((long)&begin._M_current[1].row_ep.
                           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar25);
          *puVar1 = uVar16;
          puVar1[1] = uVar17;
          *(undefined8 *)
           ((long)&begin._M_current[1].row_ep.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar25) =
               *(undefined8 *)
                ((long)&((begin._M_current)->row_ep).
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar25);
          puVar1 = (undefined8 *)
                   ((long)&((begin._M_current)->row_ep).
                           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar25);
          *puVar1 = 0;
          puVar1[1] = 0;
          *(undefined8 *)
           ((long)&((begin._M_current)->row_ep).
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar25) = 0;
          if (pvVar8 != (void *)0x0) {
            operator_delete(pvVar8);
          }
          _Var24._M_current = begin._M_current;
          if (lVar25 == 0) goto LAB_002ebbe7;
          dVar5 = *(double *)((long)&begin._M_current[-1].fractionality + lVar25);
          if ((dVar4 <= dVar5) &&
             ((dVar4 < dVar5 ||
              (uVar23 = (long)*(int *)((long)begin._M_current + lVar25 + -0x20) +
                        (comp.this)->numTries, uVar19 = uVar23 & 0xffffffff, uVar23 = uVar23 >> 0x20
              , uVar21 = (comp.this)->numTries + (long)iVar6, uVar22 = uVar21 & 0xffffffff,
              uVar21 = uVar21 >> 0x20,
              ((uVar22 + 0x42d8680e260ae5b) * (uVar21 + 0x8a183895eeac1536) ^
              (uVar21 + 0x80c8963be3e4c2f3) * (uVar22 + 0xc8497d2a400d9551) >> 0x20) <=
              ((uVar19 + 0x42d8680e260ae5b) * (uVar23 + 0x8a183895eeac1536) ^
              (uVar23 + 0x80c8963be3e4c2f3) * (uVar19 + 0xc8497d2a400d9551) >> 0x20))))) break;
          lVar25 = lVar25 + -0x38;
        }
        _Var24._M_current = (FractionalInteger *)((long)&(begin._M_current)->fractionality + lVar25)
        ;
LAB_002ebbe7:
        (_Var24._M_current)->fractionality = dVar4;
        pdVar3 = (double *)((long)&(begin._M_current)->row_ep_norm2 + lVar25);
        *pdVar3 = dVar9;
        pdVar3[1] = dVar10;
        *(int *)((long)&(begin._M_current)->basisIndex + lVar25) = iVar6;
        pvVar8 = *(void **)((long)&((begin._M_current)->row_ep).
                                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar25);
        puVar1 = (undefined8 *)
                 ((long)&((begin._M_current)->row_ep).
                         super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar25);
        *puVar1 = ppVar11;
        puVar1[1] = ppVar12;
        *(pointer *)
         ((long)&((begin._M_current)->row_ep).
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar25) = ppVar7;
        if (pvVar8 != (void *)0x0) {
          operator_delete(pvVar8);
        }
        local_90 = local_90 + ((long)pFVar20 - (long)_Var24._M_current >> 3) * 0x6db6db6db6db6db7;
        if (8 < local_90) {
          return false;
        }
      }
      lVar26 = lVar26 + 0x38;
      pFVar18 = pFVar20 + 1;
      _Var24._M_current = pFVar20;
    } while (pFVar20 + 1 != end._M_current);
  }
  return true;
}

Assistant:

inline bool partial_insertion_sort(Iter begin, Iter end, Compare comp) {
        typedef typename std::iterator_traits<Iter>::value_type T;
        if (begin == end) return true;
        
        std::size_t limit = 0;
        for (Iter cur = begin + 1; cur != end; ++cur) {
            Iter sift = cur;
            Iter sift_1 = cur - 1;

            // Compare first so we can avoid 2 moves for an element already positioned correctly.
            if (comp(*sift, *sift_1)) {
                T tmp = PDQSORT_PREFER_MOVE(*sift);

                do { *sift-- = PDQSORT_PREFER_MOVE(*sift_1); }
                while (sift != begin && comp(tmp, *--sift_1));

                *sift = PDQSORT_PREFER_MOVE(tmp);
                limit += cur - sift;
            }
            
            if (limit > partial_insertion_sort_limit) return false;
        }

        return true;
    }